

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crashcatcher.c
# Opt level: O3

size_t safe_write(int fd,void *buf,size_t len)

{
  size_t in_RAX;
  int *piVar1;
  ulong uVar2;
  size_t __n;
  bool bVar3;
  
  bVar3 = len == 0;
  if (!bVar3) {
    uVar2 = 0;
    __n = len;
    do {
      while (in_RAX = write(fd,(void *)((long)buf + uVar2),__n), in_RAX == 0xffffffffffffffff) {
        piVar1 = __errno_location();
        if (!(bool)(*piVar1 == 4 & (bVar3 ^ 1U))) {
          return CONCAT71((int7)((ulong)piVar1 >> 8),*piVar1 == 4);
        }
      }
      uVar2 = uVar2 + in_RAX;
      __n = len - uVar2;
      bVar3 = len < uVar2 || __n == 0;
    } while (len >= uVar2 && __n != 0);
  }
  return in_RAX;
}

Assistant:

static size_t safe_write(int fd, const void *buf, size_t len)
{
	size_t ret = 0;
	while(ret < len)
	{
		ssize_t rem;
		if((rem=write(fd, (const char*)buf+ret, len-ret)) == -1)
		{
			if(errno == EINTR)
				continue;
			break;
		}
		ret += rem;
	}
	return ret;
}